

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::AssertSnapEquiv_SnapPromiseResolveOrRejectFunctionInfo
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  TTD_PTR_ID *pTVar1;
  TTD_PTR_ID *pTVar2;
  
  if ((sobj1->SnapObjectTag == SnapPromiseResolveOrRejectFunctionObject) &&
     (sobj2->SnapObjectTag == SnapPromiseResolveOrRejectFunctionObject)) {
    pTVar1 = (TTD_PTR_ID *)sobj1->AddtlSnapObjectInfo;
    pTVar2 = (TTD_PTR_ID *)sobj2->AddtlSnapObjectInfo;
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Special(compareMap,*pTVar1,*pTVar2,L"promise");
    TTDCompareMap::DiagnosticAssert(compareMap,(char)pTVar1[1] == (char)pTVar2[1]);
    TTDCompareMap::DiagnosticAssert(compareMap,(char)pTVar1[3] == (char)pTVar2[3]);
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_NoEnqueue(compareMap,pTVar1[2],pTVar2[2]);
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void AssertSnapEquiv_SnapPromiseResolveOrRejectFunctionInfo(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            SnapPromiseResolveOrRejectFunctionInfo* rrfInfo1 = SnapObjectGetAddtlInfoAs<SnapPromiseResolveOrRejectFunctionInfo*, SnapObjectType::SnapPromiseResolveOrRejectFunctionObject>(sobj1);
            SnapPromiseResolveOrRejectFunctionInfo* rrfInfo2 = SnapObjectGetAddtlInfoAs<SnapPromiseResolveOrRejectFunctionInfo*, SnapObjectType::SnapPromiseResolveOrRejectFunctionObject>(sobj2);

            compareMap.CheckConsistentAndAddPtrIdMapping_Special(rrfInfo1->PromiseId, rrfInfo2->PromiseId, _u("promise"));

            compareMap.DiagnosticAssert(rrfInfo1->IsReject == rrfInfo2->IsReject);
            compareMap.DiagnosticAssert(rrfInfo1->AlreadyResolvedValue == rrfInfo2->AlreadyResolvedValue);

            compareMap.CheckConsistentAndAddPtrIdMapping_NoEnqueue(rrfInfo1->AlreadyResolvedWrapperId, rrfInfo2->AlreadyResolvedWrapperId);
        }